

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BlueRoomFiveAction.cpp
# Opt level: O1

ActionResults * __thiscall BlueRoomFiveAction::Pick(BlueRoomFiveAction *this)

{
  itemType iVar1;
  ActionResults *pAVar2;
  ItemWrapper *this_00;
  _Alloc_hider _Var3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  itemType local_5c;
  string local_58;
  string local_38;
  
  iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
  if (iVar1 == TABLET) {
    pAVar2 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_38.field_2;
    local_38._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_38,"You can\'t pick up the tablet, it is far too heavy.","");
    ActionResults::ActionResults(pAVar2,CURRENT,&local_38);
    _Var3._M_p = local_38._M_dataplus._M_p;
  }
  else {
    iVar1 = Command::getMainItem((this->super_AbstractRoomAction).commands);
    if (iVar1 != STATUE) {
      pAVar2 = AbstractRoomAction::Pick(&this->super_AbstractRoomAction);
      return pAVar2;
    }
    local_5c = STATUE;
    this_00 = ItemTable::getValue((this->super_AbstractRoomAction).itemList,&local_5c);
    ItemWrapper::setLocation(this_00,BACKPACK);
    pAVar2 = (ActionResults *)operator_new(0x30);
    paVar4 = &local_58.field_2;
    local_58._M_dataplus._M_p = (pointer)paVar4;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,
               "You lift the statue with considerable effort and are now holding it.","");
    ActionResults::ActionResults(pAVar2,CURRENT,&local_58);
    _Var3._M_p = local_58._M_dataplus._M_p;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_Var3._M_p != paVar4) {
    operator_delete(_Var3._M_p);
  }
  return pAVar2;
}

Assistant:

ActionResults * BlueRoomFiveAction::Pick() {
    if(commands->getMainItem() == TABLET) {
       return new ActionResults(CURRENT, "You can't pick up the tablet, it is far too heavy.");
    }

    if(commands->getMainItem() == STATUE){
        itemList->getValue(STATUE)->setLocation(BACKPACK);
        return new ActionResults(CURRENT, "You lift the statue with considerable effort and are now holding it.");
    }
    return AbstractRoomAction::Pick();
}